

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O0

void __thiscall SNMPPacket::setCommunityString(SNMPPacket *this,string *CommunityString)

{
  shared_ptr<OctetType> local_28;
  string *local_18;
  string *CommunityString_local;
  SNMPPacket *this_local;
  
  local_18 = CommunityString;
  CommunityString_local = (string *)this;
  std::shared_ptr<OctetType>::shared_ptr(&local_28,(nullptr_t)0x0);
  std::shared_ptr<OctetType>::operator=(&this->communityStringPtr,&local_28);
  std::shared_ptr<OctetType>::~shared_ptr(&local_28);
  std::__cxx11::string::operator=((string *)&this->communityString,(string *)local_18);
  return;
}

Assistant:

void SNMPPacket::setCommunityString(const std::string &CommunityString){
    // poison any cached containers we have
    this->communityStringPtr = nullptr;
    this->communityString = CommunityString;
}